

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::Inst::checkFeatures
                (uint32_t archType,Detail *detail,Operand_ *operands,uint32_t count,CpuFeatures *out
                )

{
  uint in_EDI;
  CpuFeatures *in_stack_00000100;
  uint32_t in_stack_0000010c;
  Operand_ *in_stack_00000110;
  Detail *in_stack_00000118;
  uint32_t in_stack_00000124;
  bool local_31;
  Error local_c;
  
  local_31 = in_EDI == 0 || 3 < in_EDI;
  if (local_31) {
    local_c = 5;
  }
  else {
    local_c = X86InstImpl::checkFeatures
                        (in_stack_00000124,in_stack_00000118,in_stack_00000110,in_stack_0000010c,
                         in_stack_00000100);
  }
  return local_c;
}

Assistant:

Error Inst::checkFeatures(uint32_t archType, const Detail& detail, const Operand_* operands, uint32_t count, CpuFeatures& out) noexcept {
  #if defined(ASMJIT_BUILD_X86)
  if (ArchInfo::isX86Family(archType))
    return X86InstImpl::checkFeatures(archType, detail, operands, count, out);
  #endif

  #if defined(ASMJIT_BUILD_ARM)
  if (ArchInfo::isArmFamily(archType))
    return ArmInstImpl::checkFeatures(archType, detail, operands, count, out);
  #endif

  return DebugUtils::errored(kErrorInvalidArch);
}